

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall despot::ChainState::Init(ChainState *this,int num_mdp_states,int num_mdp_actions)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int local_24;
  int local_20;
  int s;
  ACT_TYPE action;
  int state;
  int num_mdp_actions_local;
  int num_mdp_states_local;
  ChainState *this_local;
  
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->mdp_transitions_,(long)num_mdp_states);
  for (s = 0; s < num_mdp_states; s = s + 1) {
    pvVar1 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->mdp_transitions_,(long)s);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar1,(long)num_mdp_actions);
    for (local_20 = 0; local_20 < num_mdp_actions; local_20 = local_20 + 1) {
      pvVar1 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->mdp_transitions_,(long)s);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar1,(long)local_20);
      std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)num_mdp_states);
      for (local_24 = 0; local_24 < num_mdp_states; local_24 = local_24 + 1) {
        pvVar1 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->mdp_transitions_,(long)s);
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar1,(long)local_20);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_24);
        *pvVar3 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void ChainState::Init(int num_mdp_states, int num_mdp_actions) {
	mdp_transitions_.resize(num_mdp_states);
	for (int state = 0; state < num_mdp_states; state++) {
		mdp_transitions_[state].resize(num_mdp_actions);
		for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
			mdp_transitions_[state][action].resize(num_mdp_states);
			for (int s = 0; s < num_mdp_states; s++)
				mdp_transitions_[state][action][s] = 0;
		}
	}
}